

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

bool __thiscall Nibbler::getQuoted(Nibbler *this,char c,string *result,bool quote)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  
  std::__cxx11::string::_M_replace((ulong)result,0,(char *)result->_M_string_length,0x10f258);
  uVar7 = this->_cursor;
  if ((uVar7 < this->_length) && ((this->_input)._M_dataplus._M_p[uVar7] == c)) {
    cVar5 = '\0';
    bVar2 = false;
    bVar3 = false;
    do {
      cVar1 = (this->_input)._M_dataplus._M_p[uVar7];
      bVar4 = bVar3;
      if ((cVar1 != '\\') || (bVar2)) {
        cVar6 = (char)result;
        if ((cVar1 != c) || (bVar2)) {
          if (cVar5 != '\0') {
            std::__cxx11::string::push_back(cVar6);
          }
          std::__cxx11::string::push_back(cVar6);
          bVar2 = false;
          cVar5 = '\0';
        }
        else {
          if (quote) {
            std::__cxx11::string::push_back(cVar6);
          }
          bVar4 = true;
          if (bVar3) {
            this->_cursor = uVar7 + 1;
            return true;
          }
        }
      }
      else {
        cVar5 = '\\';
        bVar2 = true;
      }
      bVar3 = bVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->_length);
  }
  return false;
}

Assistant:

bool Nibbler::getQuoted (
  char c,
  std::string& result,
  bool quote /* = false */)
{
  bool inquote = false;
  bool inescape = false;
  char previous = 0;
  char current = 0;
  result = "";

  if (_cursor >= _length ||
      _input[_cursor] != c)
  {
    return false;
  }

  for (std::string::size_type i = _cursor; i < _length; ++i)
  {
    current = _input[i];

    if (current == '\\' && !inescape)
    {
      inescape = true;
      previous = current;
      continue;
    }

    if (current == c && !inescape)
    {
      if (quote)
        result += current;

      if (!inquote)
      {
        inquote = true;
      }
      else
      {
        _cursor = i + 1;
        return true;
      }
    }
    else
    {
      if (previous)
      {
        result += previous;
        previous = 0;
      }

      result += current;
      inescape = false;
    }
  }

  return false;
}